

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

int __thiscall
soplex::SPxScaler<double>::computeScaleExp
          (SPxScaler<double> *this,SVectorBase<double> *vec,DataArray<int> *oldScaleExp)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  double dVar4;
  ulong uVar5;
  int scaleExp;
  undefined4 uStack_84;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  double local_78;
  ulong uStack_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  
  dVar4 = 0.0;
  uVar5 = 0;
  lVar2 = 8;
  for (lVar3 = 0; lVar3 < vec->memused; lVar3 = lVar3 + 1) {
    local_68 = dVar4;
    uStack_60 = uVar5;
    local_78 = ldexp(*(double *)((long)vec->m_elem + lVar2 + -8),
                     oldScaleExp->data[*(int *)((long)&vec->m_elem->val + lVar2)]);
    uStack_70 = extraout_XMM0_Qb;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&scaleExp,
               &(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    local_48 = Tolerances::epsilon((Tolerances *)CONCAT44(uStack_84,scaleExp));
    local_78 = ABS(local_78);
    uStack_70 = uStack_70 & 0x7fffffffffffffff;
    local_58 = local_78 - local_68;
    uStack_50 = uStack_70;
    uStack_40 = extraout_XMM0_Qb_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
    dVar4 = (double)(~-(ulong)(local_48 < local_58) & (ulong)local_68 |
                    (ulong)local_78 & -(ulong)(local_48 < local_58));
    uVar5 = ~uStack_40 & uStack_60 | uStack_70 & uStack_40;
    lVar2 = lVar2 + 0x10;
  }
  iVar1 = 0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    frexp(1.0 / dVar4,&scaleExp);
    iVar1 = scaleExp + -1;
  }
  return iVar1;
}

Assistant:

int SPxScaler<R>::computeScaleExp(const SVectorBase<R>& vec,
                                  const DataArray<int>& oldScaleExp) const
{
   R maxi = 0.0;

   // find largest absolute value after applying existing scaling factors
   for(int i = 0; i < vec.size(); ++i)
   {
      R x = spxAbs(spxLdexp(vec.value(i), oldScaleExp[vec.index(i)]));

      if(GT(x, maxi, this->tolerances()->epsilon()))
         maxi = x;
   }

   // empty rows/cols are possible
   if(maxi == 0.0)
      return 0;
   // get exponent corresponding to new scaling factor
   else
   {
      int scaleExp;
      spxFrexp(R(1.0 / maxi), &(scaleExp));
      return scaleExp - 1;
   }
}